

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int spi_xfer(uint handle,char *txBuf,char *rxBuf,uint count)

{
  int iVar1;
  gpioExtent_t *in_RSI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fc8;
  int in_stack_00000fcc;
  void *in_stack_00000fd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff8;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,0,
                             in_RSI,in_stack_fffffffffffffff8);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000fd0,in_stack_00000fcc,in_stack_00000fc8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return iVar1;
}

Assistant:

int spi_xfer(unsigned handle, char *txBuf, char *rxBuf, unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=0
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = txBuf;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_SPIX, handle, 0, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(rxBuf, count, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}